

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::LookupAny
          (PersistentStorageJson *this,BorderRouter *aValue,
          vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          *aRet)

{
  _Invoker_type aRet_00;
  Status SVar1;
  string local_220;
  function<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&)> local_200;
  BorderRouter local_1d0;
  anon_class_1_0_00000001 local_41;
  undefined1 local_40 [8];
  function<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&)> pred;
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  *aRet_local;
  BorderRouter *aValue_local;
  PersistentStorageJson *this_local;
  
  pred._M_invoker = (_Invoker_type)aRet;
  std::function<bool(ot::commissioner::persistent_storage::BorderRouter_const&)>::
  function<ot::commissioner::persistent_storage::PersistentStorageJson::LookupAny(ot::commissioner::persistent_storage::BorderRouter_const&,std::vector<ot::commissioner::persistent_storage::BorderRouter,std::allocator<ot::commissioner::persistent_storage::BorderRouter>>&)::__0,void>
            ((function<bool(ot::commissioner::persistent_storage::BorderRouter_const&)> *)local_40,
             &local_41);
  BorderRouter::BorderRouter(&local_1d0,aValue);
  std::function<bool(ot::commissioner::persistent_storage::BorderRouter_const&)>::operator=
            ((function<bool(ot::commissioner::persistent_storage::BorderRouter_const&)> *)local_40,
             (anon_class_392_1_4b93a6ce *)&local_1d0);
  LookupAny(ot::commissioner::persistent_storage::BorderRouter_const&,std::vector<ot::commissioner::persistent_storage::BorderRouter,std::allocator<ot::commissioner::persistent_storage::BorderRouter>>&)
  ::$_1::~__1((__1 *)&local_1d0);
  std::function<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&)>::function
            (&local_200,
             (function<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&)> *)local_40
            );
  aRet_00 = pred._M_invoker;
  std::__cxx11::string::string((string *)&local_220,(string *)JSON_BR_abi_cxx11_);
  SVar1 = LookupPred<ot::commissioner::persistent_storage::BorderRouter>
                    (this,&local_200,
                     (vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      *)aRet_00,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::function<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&)>::~function
            (&local_200);
  std::function<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&)>::~function
            ((function<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&)> *)local_40
            );
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::LookupAny(BorderRouter const &aValue, std::vector<BorderRouter> &aRet)
{
    std::function<bool(BorderRouter const &)> pred = [](BorderRouter const &) { return true; };

    pred = [aValue](BorderRouter const &el) {
        bool aRet =
            (aValue.mId.mId == EMPTY_ID || (el.mId.mId == aValue.mId.mId)) ||
            (aValue.mNetworkId.mId == EMPTY_ID || (el.mNetworkId.mId == aValue.mNetworkId.mId)) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kAddrBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kAddrBit) != 0 ||
              CaseInsensitiveEqual(el.mAgent.mAddr, aValue.mAgent.mAddr))) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kPortBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kPortBit) != 0 || el.mAgent.mPort == aValue.mAgent.mPort)) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kThreadVersionBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kThreadVersionBit) != 0 ||
              aValue.mAgent.mThreadVersion == el.mAgent.mThreadVersion)) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kStateBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kStateBit) != 0 || el.mAgent.mState == aValue.mAgent.mState)) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kVendorNameBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kVendorNameBit) != 0 ||
              CaseInsensitiveEqual(el.mAgent.mVendorName, aValue.mAgent.mVendorName))) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kModelNameBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kModelNameBit) != 0 ||
              CaseInsensitiveEqual(el.mAgent.mModelName, aValue.mAgent.mModelName))) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kActiveTimestampBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kActiveTimestampBit) != 0 ||
              el.mAgent.mActiveTimestamp.Encode() == aValue.mAgent.mActiveTimestamp.Encode())) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kPartitionIdBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kPartitionIdBit) != 0 ||
              el.mAgent.mPartitionId == aValue.mAgent.mPartitionId)) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kVendorDataBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kVendorDataBit) != 0 ||
              el.mAgent.mVendorData == aValue.mAgent.mVendorData)) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kVendorOuiBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kVendorOuiBit) != 0 ||
              el.mAgent.mVendorOui == aValue.mAgent.mVendorOui)) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kBbrSeqNumberBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kBbrSeqNumberBit) != 0 ||
              el.mAgent.mBbrSeqNumber == aValue.mAgent.mBbrSeqNumber)) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kBbrPortBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kBbrPortBit) != 0 ||
              el.mAgent.mBbrPort == aValue.mAgent.mBbrPort));
        return aRet;
    };

    return LookupPred<BorderRouter>(pred, aRet, JSON_BR);
}